

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O1

void __thiscall wasm::PostEmscripten::removeEmJsExports(PostEmscripten *this,Module *module)

{
  SmallVector<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_10UL>
  *pSVar1;
  pointer puVar2;
  Export *__args;
  pointer puVar3;
  Global *pGVar4;
  pointer puVar5;
  Function *pFVar6;
  ElementSegment *pEVar7;
  pointer ppEVar8;
  pointer puVar9;
  DataSegment *pDVar10;
  size_t sVar11;
  char *pcVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ExternalKind EVar15;
  undefined4 uVar16;
  pointer pEVar17;
  Module *this_00;
  int iVar18;
  variant<wasm::Name,_wasm::HeapType> *pvVar19;
  pointer ppEVar20;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar21;
  pointer puVar22;
  pointer pEVar23;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr_1;
  pointer puVar24;
  pointer puVar25;
  pointer puVar26;
  undefined1 auStack_148 [8];
  EmJsWalker walker;
  Expression *local_48;
  pointer local_40;
  Module *local_38;
  
  pSVar1 = &walker.
            super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
            .stack;
  auStack_148 = (undefined1  [8])pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_148,"post-emscripten-side-module","");
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currModule._0_1_ = Pass::hasArgument(&this->super_Pass,(string *)auStack_148);
  if (auStack_148 != (undefined1  [8])pSVar1) {
    operator_delete((void *)auStack_148,
                    walker.
                    super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                    .stack.usedFixed + 1);
  }
  auStack_148 = (undefined1  [8])0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .replacep = (Expression **)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.sideModule = false;
  walker._217_7_ = 0;
  walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar21 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currFunction = (Function *)module;
  if (puVar21 != puVar2) {
    do {
      __args = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((((char)walker.
                  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                  .currModule == '\0') &&
          (_ZN4wasm12_GLOBAL__N_112EM_JS_PREFIXE_0 <= *(ulong *)&(__args->name).super_IString)) &&
         ((_ZN4wasm12_GLOBAL__N_112EM_JS_PREFIXE_0 == 0 ||
          (iVar18 = bcmp(*(char **)((long)&(__args->name).super_IString + 8),
                         _ZN4wasm12_GLOBAL__N_112EM_JS_PREFIXE_1,
                         _ZN4wasm12_GLOBAL__N_112EM_JS_PREFIXE_0), iVar18 == 0)))) {
        if (walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start ==
            walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Export,std::allocator<wasm::Export>>::
          _M_realloc_insert<wasm::Export_const&>
                    ((vector<wasm::Export,std::allocator<wasm::Export>> *)&walker.sideModule,
                     (iterator)
                     walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          sVar11 = *(size_t *)&(__args->name).super_IString;
          pcVar12 = *(char **)((long)&(__args->name).super_IString + 8);
          EVar15 = __args->kind;
          uVar16 = *(undefined4 *)&__args->field_0x14;
          uVar13 = *(undefined8 *)
                    &(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                     super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                     super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                     super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
          uVar14 = *(undefined8 *)
                    ((long)&(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10);
          *(undefined8 *)
           ((long)&((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start)->value).
                   super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) =
               *(undefined8 *)
                ((long)&(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8);
          *(undefined8 *)
           ((long)&((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start)->value).
                   super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = uVar14;
          (walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
           super__Vector_impl_data._M_start)->kind = EVar15;
          *(undefined4 *)
           &(walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
             .super__Vector_impl_data._M_start)->field_0x14 = uVar16;
          *(undefined8 *)
           &((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
              _M_impl.super__Vector_impl_data._M_start)->value).
            super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u = uVar13;
          ((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start)->name).super_IString.str._M_len = sVar11;
          ((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start)->name).super_IString.str._M_str = pcVar12;
          walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start =
               walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      if ((_ZN4wasm12_GLOBAL__N_117EM_JS_DEPS_PREFIXE_0 <= *(ulong *)&(__args->name).super_IString)
         && ((_ZN4wasm12_GLOBAL__N_117EM_JS_DEPS_PREFIXE_0 == 0 ||
             (iVar18 = bcmp(*(char **)((long)&(__args->name).super_IString + 8),
                            _ZN4wasm12_GLOBAL__N_117EM_JS_DEPS_PREFIXE_1,
                            _ZN4wasm12_GLOBAL__N_117EM_JS_DEPS_PREFIXE_0), iVar18 == 0)))) {
        if (walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start ==
            walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Export,std::allocator<wasm::Export>>::
          _M_realloc_insert<wasm::Export_const&>
                    ((vector<wasm::Export,std::allocator<wasm::Export>> *)&walker.sideModule,
                     (iterator)
                     walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          sVar11 = *(size_t *)&(__args->name).super_IString;
          pcVar12 = *(char **)((long)&(__args->name).super_IString + 8);
          EVar15 = __args->kind;
          uVar16 = *(undefined4 *)&__args->field_0x14;
          uVar13 = *(undefined8 *)
                    &(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                     super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                     super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                     super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
          uVar14 = *(undefined8 *)
                    ((long)&(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10);
          *(undefined8 *)
           ((long)&((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start)->value).
                   super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) =
               *(undefined8 *)
                ((long)&(__args->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8);
          *(undefined8 *)
           ((long)&((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                     ._M_impl.super__Vector_impl_data._M_start)->value).
                   super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = uVar14;
          (walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
           super__Vector_impl_data._M_start)->kind = EVar15;
          *(undefined4 *)
           &(walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
             .super__Vector_impl_data._M_start)->field_0x14 = uVar16;
          *(undefined8 *)
           &((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
              _M_impl.super__Vector_impl_data._M_start)->value).
            super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u = uVar13;
          ((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start)->name).super_IString.str._M_len = sVar11;
          ((walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start)->name).super_IString.str._M_str = pcVar12;
          walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start =
               walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar2);
  }
  puVar24 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar24 != puVar3) {
    do {
      pGVar4 = (puVar24->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar4->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)auStack_148,&pGVar4->init);
      }
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar3);
  }
  puVar25 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar25 != puVar5) {
    do {
      pFVar6 = (puVar25->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar6->super_Importable).module + 8) == (char *)0x0) {
        walker.
        super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pFVar6;
        Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)auStack_148,&pFVar6->body);
        walker.
        super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar5);
  }
  puVar22 = (module->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (module->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = module;
  if (puVar22 != local_40) {
    do {
      pEVar7 = (puVar22->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(pEVar7->table).super_IString + 8) != (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)auStack_148,&pEVar7->offset);
      }
      ppEVar8 = *(pointer *)
                 ((long)&(pEVar7->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 + 8);
      for (ppEVar20 = *(pointer *)
                       &(pEVar7->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar20 != ppEVar8; ppEVar20 = ppEVar20 + 1) {
        local_48 = *ppEVar20;
        Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)auStack_148,&local_48);
      }
      puVar22 = puVar22 + 1;
    } while (puVar22 != local_40);
  }
  this_00 = local_38;
  puVar26 = (local_38->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (local_38->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar26 != puVar9) {
    do {
      pDVar10 = (puVar26->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar10->isPassive == false) {
        Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)auStack_148,&pDVar10->offset);
      }
      puVar26 = puVar26 + 1;
    } while (puVar26 != puVar9);
  }
  pEVar17 = walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
            super__Vector_impl_data._M_start;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currFunction = (Function *)0x0;
  pEVar23 = (pointer)walker._216_8_;
  do {
    if (pEVar23 == pEVar17) {
      if (walker._216_8_ != 0) {
        operator_delete((void *)walker._216_8_,
                        (long)walker.toRemove.
                              super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                              _M_impl.super__Vector_impl_data._M_finish - walker._216_8_);
      }
      if (walker.
          super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        operator_delete(walker.
                        super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                        .stack.fixed._M_elems[9].currp,
                        (long)walker.
                              super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)walker.
                              super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                              .stack.fixed._M_elems[9].currp);
      }
      return;
    }
    if (pEVar23->kind == Global) {
      if (*(__index_type *)
           ((long)&(pEVar23->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
        pvVar19 = &pEVar23->value;
      }
      else {
        pvVar19 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      Module::removeGlobal
                (this_00,(IString)*(IString *)
                                   &(pvVar19->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u);
    }
    else {
      if (pEVar23->kind != Function) {
        __assert_fail("exp.kind == ExternalKind::Global",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp"
                      ,0xf7,"void wasm::PostEmscripten::removeEmJsExports(Module &)");
      }
      if (*(__index_type *)
           ((long)&(pEVar23->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
        pvVar19 = &pEVar23->value;
      }
      else {
        pvVar19 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      Module::removeFunction
                (this_00,(IString)*(IString *)
                                   &(pvVar19->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u);
    }
    Module::removeExport(this_00,(Name)(pEVar23->name).super_IString.str);
    pEVar23 = pEVar23 + 1;
  } while( true );
}

Assistant:

void removeEmJsExports(Module& module) {
    auto sideModule = hasArgument("post-emscripten-side-module");
    EmJsWalker walker(sideModule);
    walker.walkModule(&module);
    for (Export& exp : walker.toRemove) {
      if (exp.kind == ExternalKind::Function) {
        module.removeFunction(*exp.getInternalName());
      } else {
        assert(exp.kind == ExternalKind::Global);
        module.removeGlobal(*exp.getInternalName());
      }
      module.removeExport(exp.name);
    }
  }